

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::GetReferenceIndexVec
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,
          TPZManVector<TPZCompMesh_*,_10> *cmeshVec,
          set<long,_std::less<long>,_std::allocator<long>_> *refIndexVec)

{
  long lVar1;
  long lVar2;
  int iVar3;
  TPZCompEl **ppTVar4;
  TPZGeoEl *pTVar5;
  TPZGeoElSide *this_00;
  long lVar6;
  long nelem;
  TPZStack<TPZCompElSide,_10> sidevec;
  int64_t local_f8;
  TPZManVector<TPZCompElSide,_10> local_f0;
  
  if ((cmeshVec->super_TPZVec<TPZCompMesh_*>).fNElements != 0) {
    TPZGeoMesh::ResetReference((*(cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore)->fReference);
    lVar1 = (cmeshVec->super_TPZVec<TPZCompMesh_*>).fNElements;
    if (0 < lVar1) {
      lVar6 = 0;
      do {
        TPZCompMesh::LoadReferences((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
    }
    lVar6 = 0x28;
    do {
      *(undefined8 *)((long)&local_f8 + lVar6) = 0;
      *(undefined4 *)
       ((long)&(((TPZManVector<TPZCompElSide,_10> *)(local_f0.fExtAlloc + -2))->
               super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar6) = 0xffffffff;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 200);
    local_f0.super_TPZVec<TPZCompElSide>.fStore = local_f0.fExtAlloc;
    local_f0.super_TPZVec<TPZCompElSide>.fNElements = 0;
    local_f0.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZVec<TPZCompElSide>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01842198;
    if (0 < lVar1) {
      lVar6 = 0;
      do {
        lVar2 = ((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar6]->fElementVec).
                super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
        if (0 < lVar2) {
          nelem = 0;
          do {
            ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                                (&((cmeshVec->super_TPZVec<TPZCompMesh_*>).fStore[lVar6]->
                                  fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
            if (*ppTVar4 != (TPZCompEl *)0x0) {
              pTVar5 = TPZCompEl::Reference(*ppTVar4);
              iVar3 = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
              this_00 = (TPZGeoElSide *)operator_new(0x18);
              (this_00->super_TPZSavable)._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_01920090;
              this_00->fGeoEl = pTVar5;
              this_00->fSide = iVar3 + -1;
              TPZManVector<TPZCompElSide,_10>::Resize(&local_f0,0);
              TPZGeoElSide::HigherLevelCompElementList2
                        (this_00,(TPZStack<TPZCompElSide,_10> *)&local_f0,1,1);
              if (local_f0.super_TPZVec<TPZCompElSide>.fNElements == 0) {
                local_f8 = pTVar5->fIndex;
                std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                _M_insert_unique<long>(&refIndexVec->_M_t,&local_f8);
              }
            }
            nelem = nelem + 1;
          } while (lVar2 != nelem);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar1);
    }
    if (local_f0.super_TPZVec<TPZCompElSide>.fStore == local_f0.fExtAlloc) {
      local_f0.super_TPZVec<TPZCompElSide>.fStore = (TPZCompElSide *)0x0;
    }
    local_f0.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
    local_f0.super_TPZVec<TPZCompElSide>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b970;
    if (local_f0.super_TPZVec<TPZCompElSide>.fStore != (TPZCompElSide *)0x0) {
      operator_delete__(local_f0.super_TPZVec<TPZCompElSide>.fStore);
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::GetReferenceIndexVec(TPZManVector<TPZCompMesh *> cmeshVec, std::set<int64_t> &refIndexVec){
    
    if(cmeshVec.NElements() == 0) return;
    TPZCompMesh *cmesh = cmeshVec[0];
    TPZGeoMesh *gmesh = cmesh->Reference();
    gmesh->ResetReference();
    int64_t isub;
    int64_t ncm = cmeshVec.NElements();
    for (isub=0; isub<ncm; isub++) {
        cmeshVec[isub]->LoadReferences();
    }
    int64_t ncel;
    TPZStack<TPZCompElSide> sidevec;
    for(int64_t i = 0; i< ncm; i++){
        ncel = cmeshVec[i]->NElements();
        for (int64_t j=0; j<ncel; j++) {
            TPZCompEl * cel = cmeshVec[i]->ElementVec()[j];
            if(cel){
                TPZGeoEl *geoel = cel->Reference();
                
#ifdef PZDEBUG
                if (!geoel){
                    PZError << "Error at " << __PRETTY_FUNCTION__ << " Geometry element null!\n";
                    DebugStop();
                }
#endif
                
                int ns = geoel->NSides();
                TPZGeoElSide *geoside = new TPZGeoElSide(geoel,ns-1);
                sidevec.Resize(0);
                geoside->HigherLevelCompElementList2(sidevec, 1,1);
                int64_t nel = sidevec.NElements();
                if (nel==0){
                    //std::cout << "Incluindo elemento " << geoel->Index() << std::endl;
                    refIndexVec.insert(geoel->Index());
                }
            }
        }
    }
    
    
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Number of elements : " << refIndexVec.size() << std::endl;
        sout <<"Reference index of elements : "<< std::endl;
        std::set<int64_t>::iterator it;
        for (it=refIndexVec.begin() ; it != refIndexVec.end(); it++ )
            sout << " " << *it;
        sout << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
}